

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O0

int Cgt_ManCheckGateComplete
              (Aig_Man_t *pAig,Vec_Vec_t *vGatesAll,Aig_Obj_t *pGate,Vec_Ptr_t *vFanout)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pObj_00;
  Vec_Ptr_t *p;
  int local_44;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vGates;
  Vec_Ptr_t *vFanout_local;
  Aig_Obj_t *pGate_local;
  Vec_Vec_t *vGatesAll_local;
  Aig_Man_t *pAig_local;
  
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vFanout);
    if (iVar1 <= local_44) {
      return 1;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(vFanout,local_44);
    iVar1 = Saig_ObjIsPo(pAig,pObj_00);
    if (iVar1 != 0) break;
    iVar1 = Aig_ObjCioId(pObj_00);
    iVar2 = Saig_ManPoNum(pAig);
    p = Vec_VecEntry(vGatesAll,iVar1 - iVar2);
    iVar1 = Vec_PtrFind(p,pGate);
    if (iVar1 == -1) {
      return 0;
    }
    local_44 = local_44 + 1;
  }
  return 0;
}

Assistant:

int Cgt_ManCheckGateComplete( Aig_Man_t * pAig, Vec_Vec_t * vGatesAll, Aig_Obj_t * pGate, Vec_Ptr_t * vFanout )
{
    Vec_Ptr_t * vGates;
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, vFanout, pObj, i )
    {
        if ( Saig_ObjIsPo(pAig, pObj) )
            return 0;
        vGates = Vec_VecEntry( vGatesAll, Aig_ObjCioId(pObj) - Saig_ManPoNum(pAig) );
        if ( Vec_PtrFind( vGates, pGate ) == -1 )
            return 0;            
    }
    return 1;
}